

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O0

bool __thiscall ON_Leader::Write(ON_Leader *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool rc;
  int chunk_version;
  ON_BinaryArchive *archive_local;
  ON_Leader *this_local;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmAnonymousChunk(archive,1);
  if (bVar1) {
    this_local._7_1_ = false;
    bVar1 = ON_Annotation::Internal_WriteAnnotation(&this->super_ON_Annotation,archive);
    if ((bVar1) &&
       (bVar1 = ON_BinaryArchive::WriteArray
                          (archive,&(this->m_points).super_ON_SimpleArray<ON_2dPoint>), bVar1)) {
      this_local._7_1_ = true;
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    if (!bVar1) {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Leader::Write(ON_BinaryArchive& archive) const
{
  const int chunk_version = 1;
  if (!archive.BeginWrite3dmAnonymousChunk(chunk_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (false == ON_Annotation::Internal_WriteAnnotation(archive))
      break;

    if (!archive.WriteArray(m_points))
      break;

    rc = true;
    break;
  }

  if (!archive.EndWrite3dmChunk())
    rc = false;

  return rc;
}